

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcStairFlight::IfcStairFlight(IfcStairFlight *this)

{
  *(undefined ***)&this->field_0x198 = &PTR__Object_007e4a70;
  *(undefined8 *)&this->field_0x1a0 = 0;
  *(char **)&this->field_0x1a8 = "IfcStairFlight";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00886280);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlight,_4UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x886150;
  *(undefined8 *)&this->field_0x198 = 0x886268;
  *(undefined8 *)&this->field_0x88 = 0x886178;
  *(undefined8 *)&this->field_0x98 = 0x8861a0;
  *(undefined8 *)&this->field_0xd0 = 0x8861c8;
  *(undefined8 *)&this->field_0x100 = 0x8861f0;
  *(undefined8 *)&this->field_0x138 = 0x886218;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlight,_4UL>)._vptr_ObjectHelper =
       (_func_int **)0x886240;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlight,_4UL>).field_0x18 = 0;
  this->field_0x170 = 0;
  (this->RiserHeight).have = false;
  (this->TreadLength).have = false;
  return;
}

Assistant:

IfcStairFlight() : Object("IfcStairFlight") {}